

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localpointer.h
# Opt level: O1

void __thiscall
icu_63::LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
          (LocalPointer<icu_63::UnicodeSet> *this,UnicodeSet *p,UErrorCode *errorCode)

{
  UnicodeSet *pUVar1;
  UnicodeSet *p_00;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = (this->super_LocalPointerBase<icu_63::UnicodeSet>).ptr;
    if (pUVar1 != (UnicodeSet *)0x0) {
      p_00 = p;
      UnicodeSet::~UnicodeSet(pUVar1);
      UMemory::operator_delete((UMemory *)pUVar1,p_00);
    }
    (this->super_LocalPointerBase<icu_63::UnicodeSet>).ptr = p;
    if (p == (UnicodeSet *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  else if (p != (UnicodeSet *)0x0) {
    pUVar1 = p;
    UnicodeSet::~UnicodeSet(p);
    UMemory::operator_delete((UMemory *)p,pUVar1);
    return;
  }
  return;
}

Assistant:

void adoptInsteadAndCheckErrorCode(T *p, UErrorCode &errorCode) {
        if(U_SUCCESS(errorCode)) {
            delete LocalPointerBase<T>::ptr;
            LocalPointerBase<T>::ptr=p;
            if(p==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
            }
        } else {
            delete p;
        }
    }